

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadBodyMesh.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadBodyMesh::OutputSimpleMesh
          (ChLoadBodyMesh *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *vert_pos,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *vert_vel,
          vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *triangles)

{
  element_type *peVar1;
  long lVar2;
  pointer pCVar3;
  ulong uVar4;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (vert_pos,((long)(this->contactmesh).m_vertices.
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->contactmesh).m_vertices.
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (vert_vel,((long)(this->contactmesh).m_vertices.
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->contactmesh).m_vertices.
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::operator=
            (triangles,&(this->contactmesh).m_face_v_indices);
  pCVar3 = (this->contactmesh).m_vertices.
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->contactmesh).m_vertices.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar3) {
    lVar2 = 0;
    uVar4 = 0;
    do {
      peVar1 = (this->contactbody).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      ChTransform<double>::TransformLocalToParent
                ((ChVector<double> *)((long)pCVar3->m_data + lVar2),
                 &(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  coord.pos,
                 &(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                  Amatrix);
      pCVar3 = (vert_pos->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((undefined8 *)((long)pCVar3->m_data + lVar2) != &local_48) {
        *(undefined8 *)((long)pCVar3->m_data + lVar2) = local_48;
        *(undefined8 *)((long)pCVar3->m_data + lVar2 + 8) = local_40;
        *(undefined8 *)((long)pCVar3->m_data + lVar2 + 0x10) = local_38;
      }
      ChFrameMoving<double>::PointSpeedLocalToParent
                (&(((this->contactbody).
                    super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_ChBodyFrame).super_ChFrameMoving<double>,
                 (ChVector<double> *)
                 ((long)((this->contactmesh).m_vertices.
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar2));
      pCVar3 = (vert_vel->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((undefined8 *)((long)pCVar3->m_data + lVar2) != &local_48) {
        *(undefined8 *)((long)pCVar3->m_data + lVar2) = local_48;
        *(undefined8 *)((long)pCVar3->m_data + lVar2 + 8) = local_40;
        *(undefined8 *)((long)pCVar3->m_data + lVar2 + 0x10) = local_38;
      }
      pCVar3 = (this->contactmesh).m_vertices.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar4 < (ulong)(((long)(this->contactmesh).m_vertices.
                                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void ChLoadBodyMesh::OutputSimpleMesh(
    std::vector<ChVector<>>& vert_pos,     // array of vertexes (absolute xyz positions)
    std::vector<ChVector<>>& vert_vel,     // array of vertexes (absolute xyz velocities, might be useful)
    std::vector<ChVector<int>>& triangles  // array of triangles (indexes to vertexes, ccw)
) {
    vert_pos.resize(contactmesh.m_vertices.size());
    vert_vel.resize(contactmesh.m_vertices.size());
    triangles = contactmesh.m_face_v_indices;
    // Transform the body-relative collision mesh into the output vectors with positions and speeds in absolute coords
    for (size_t i = 0; i < contactmesh.m_vertices.size(); ++i) {
        vert_pos[i] = contactbody->TransformPointLocalToParent(contactmesh.m_vertices[i]);
        vert_vel[i] = contactbody->PointSpeedLocalToParent(contactmesh.m_vertices[i]);
    }
}